

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::p_formatter<spdlog::details::scoped_padder>::format
          (p_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  char *s;
  tm *in_RDX;
  scoped_padder p;
  size_t field_size;
  scoped_padder *in_stack_ffffffffffffff90;
  memory_buf_t *in_stack_ffffffffffffff98;
  memory_buf_t *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  scoped_padder *in_stack_ffffffffffffffb0;
  
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
             (padding_info *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  s = ampm(in_RDX);
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff90,s);
  view.size_ = (size_t)in_stack_ffffffffffffffb0;
  view.data_ = in_stack_ffffffffffffffa8;
  fmt_helper::append_string_view(view,in_stack_ffffffffffffffa0);
  scoped_padder::~scoped_padder(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }